

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# miniply.cpp
# Opt level: O1

bool miniply::double_literal(char *start,char **end,double *val)

{
  byte *pbVar1;
  char cVar2;
  byte bVar3;
  byte *pbVar4;
  byte *pbVar5;
  bool bVar6;
  double dVar7;
  double dVar8;
  
  cVar2 = *start;
  pbVar4 = (byte *)(start + ((cVar2 - 0x2bU & 0xfd) == 0));
  bVar3 = *pbVar4 - 0x30;
  dVar8 = 0.0;
  if (bVar3 < 10) {
    do {
      dVar8 = dVar8 * 10.0 + *(double *)(&UINT_00109080 + (long)(char)*pbVar4 * 2);
      pbVar1 = pbVar4 + 1;
      pbVar4 = pbVar4 + 1;
    } while ((byte)(*pbVar1 - 0x30) < 10);
LAB_00105911:
    if (*pbVar4 == 0x2e) {
      pbVar1 = pbVar4 + 1;
      pbVar4 = pbVar4 + 1;
      if ((byte)(*pbVar1 - 0x30) < 10) {
        dVar7 = 0.1;
        do {
          dVar8 = dVar8 + *(double *)(&UINT_00109080 + (long)(char)*pbVar4 * 2) * dVar7;
          dVar7 = dVar7 * 0.1;
          pbVar1 = pbVar4 + 1;
          pbVar4 = pbVar4 + 1;
        } while ((byte)(*pbVar1 - 0x30) < 10);
      }
      else if (9 < bVar3) goto LAB_00105a52;
    }
    if ((*pbVar4 | 0x20) == 0x65) {
      pbVar1 = pbVar4 + 1;
      bVar6 = (*pbVar1 - 0x2b & 0xfd) == 0;
      pbVar5 = pbVar4 + 1;
      if (bVar6) {
        pbVar5 = pbVar4 + 2;
      }
      bVar3 = pbVar4[(ulong)bVar6 + 1];
      pbVar4 = pbVar5;
      if ((byte)(bVar3 - 0x30) < 10) {
        dVar7 = 0.0;
        do {
          dVar7 = dVar7 * 10.0 + *(double *)(&UINT_00109080 + (long)(char)*pbVar5 * 2);
          pbVar4 = pbVar5 + 1;
          pbVar5 = pbVar5 + 1;
        } while ((byte)(*pbVar4 - 0x30) < 10);
        pbVar4 = pbVar5;
        if (val != (double *)0x0) {
          if (*pbVar1 == 0x2d) {
            dVar7 = -dVar7;
          }
          dVar7 = pow(10.0,dVar7);
          dVar8 = dVar8 * dVar7;
        }
      }
      if (9 < (byte)(bVar3 - 0x30)) goto LAB_00105a52;
    }
    bVar3 = *pbVar4;
    bVar6 = false;
    if ((((bVar3 != 0x2e) && (bVar6 = false, bVar3 != 0x5f)) &&
        (bVar6 = false, 9 < (byte)(bVar3 - 0x30))) && (0x19 < (byte)((bVar3 | 0x20) + 0x9f))) {
      if (val != (double *)0x0) {
        if (cVar2 == '-') {
          dVar8 = -dVar8;
        }
        *val = dVar8;
      }
      bVar6 = true;
      if (end != (char **)0x0) {
        *end = (char *)pbVar4;
      }
    }
  }
  else {
    if (*pbVar4 == 0x2e) goto LAB_00105911;
LAB_00105a52:
    bVar6 = false;
  }
  return bVar6;
}

Assistant:

static bool double_literal(const char* start, char const** end, double* val)
  {
    const char* pos = start;

    bool negative = false;
    if (*pos == '-') {
      negative = true;
      ++pos;
    }
    else if (*pos == '+') {
      ++pos;
    }

    double localVal = 0.0;

    bool hasIntDigits = is_digit(*pos);
    if (hasIntDigits) {
      do {
        localVal = localVal * 10.0 + kDoubleDigits[*pos - '0'];
        ++pos;
      } while (is_digit(*pos));
    }
    else if (*pos != '.') {
//      set_error("Not a floating point number");
      return false;
    }

    bool hasFracDigits = false;
    if (*pos == '.') {
      ++pos;
      hasFracDigits = is_digit(*pos);
      if (hasFracDigits) {
        double scale = 0.1;
        do {
          localVal += scale * kDoubleDigits[*pos - '0'];
          scale *= 0.1;
          ++pos;
        } while (is_digit(*pos));
      }
      else if (!hasIntDigits) {
//        set_error("Floating point number has no digits before or after the decimal point");
        return false;
      }
    }

    bool hasExponent = *pos == 'e' || *pos == 'E';
    if (hasExponent) {
      ++pos;
      bool negativeExponent = false;
      if (*pos == '-') {
        negativeExponent = true;
        ++pos;
      }
      else if (*pos == '+') {
        ++pos;
      }

      if (!is_digit(*pos)) {
//        set_error("Floating point exponent has no digits");
        return false; // error: exponent part has no digits.
      }

      double exponent = 0.0;
      do {
        exponent = exponent * 10.0 + kDoubleDigits[*pos - '0'];
        ++pos;
      } while (is_digit(*pos));

      if (val != nullptr) {
        if (negativeExponent) {
          exponent = -exponent;
        }
        localVal *= std::pow(10.0, exponent);
      }
    }

    if (*pos == '.' || *pos == '_' || is_alnum(*pos)) {
//      set_error("Floating point number has trailing chars");
      return false;
    }

    if (negative) {
      localVal = -localVal;
    }

    if (val != nullptr) {
      *val = localVal;
    }
    if (end != nullptr) {
      *end = pos;
    }
    return true;
  }